

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugDumpDTD(FILE *output,xmlDtdPtr dtd)

{
  undefined1 local_b8 [8];
  xmlDebugCtxt ctxt;
  xmlDtdPtr dtd_local;
  FILE *output_local;
  
  dtd_local = (xmlDtdPtr)output;
  if (output == (FILE *)0x0) {
    dtd_local = _stdout;
  }
  ctxt._152_8_ = dtd;
  xmlCtxtDumpInitCtxt((xmlDebugCtxtPtr)local_b8);
  ctxt.errors = ctxt.errors | 1;
  local_b8 = (undefined1  [8])dtd_local;
  xmlCtxtDumpDTD((xmlDebugCtxtPtr)local_b8,(xmlDtdPtr)ctxt._152_8_);
  xmlCtxtDumpCleanCtxt((xmlDebugCtxtPtr)local_b8);
  return;
}

Assistant:

void
xmlDebugDumpDTD(FILE * output, xmlDtdPtr dtd)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.options |= DUMP_TEXT_TYPE;
    ctxt.output = output;
    xmlCtxtDumpDTD(&ctxt, dtd);
    xmlCtxtDumpCleanCtxt(&ctxt);
}